

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O2

void __thiscall BenchMark::run(BenchMark *this)

{
  ostream *poVar1;
  size_t sVar2;
  int i;
  ulong uVar3;
  bool bVar4;
  _Bind<void_(BenchMark::*(BenchMark_*,_int))(int)> local_108;
  ThreadTask local_e8;
  ThreadPool threadPool;
  
  g_is_loop = true;
  addsig(0xe);
  addsig(0xf);
  alarm(gOption.duration_);
  ThreadPool::ThreadPool(&threadPool,gOption.thread_num_ - 1);
  for (uVar3 = 1; uVar3 < gOption.thread_num_; uVar3 = uVar3 + 1) {
    local_108._M_f = (offset_in_BenchMark_to_subr)benchmark;
    local_108._8_8_ = 0;
    local_108._M_bound_args.super__Tuple_impl<0UL,_BenchMark_*,_int>.super__Tuple_impl<1UL,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = SUB84(uVar3,0);
    local_108._M_bound_args.super__Tuple_impl<0UL,_BenchMark_*,_int>.
    super__Head_base<0UL,_BenchMark_*,_false>._M_head_impl = this;
    std::function<void()>::function<std::_Bind<void(BenchMark::*(BenchMark*,int))(int)>,void>
              ((function<void()> *)&local_e8,&local_108);
    ThreadPool::appendTask(&threadPool,&local_e8);
    std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  }
  ThreadPool::run(&threadPool);
  benchmark(this,0);
  sVar2 = gOption.thread_num_;
  do {
    bVar4 = sVar2 != 0;
    sVar2 = sVar2 - 1;
  } while (bVar4);
  for (uVar3 = 0; uVar3 < gOption.thread_num_; uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"this is thread ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    std::operator<<(poVar1," :\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tconnect  time : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," use : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," us\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tuse      time : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," \n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\trequest  num  : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," \n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tresponse num  : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," \n");
  }
  std::operator<<((ostream *)&std::cout,"total result : \n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal request  num  is : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal response num  is : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal use     time  is : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\tQPS                 is : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  ThreadPool::~ThreadPool(&threadPool);
  return;
}

Assistant:

void BenchMark::run()
{
    g_is_loop = true;
    //设置测试时间
    addsig(SIGALRM);
    addsig(SIGTERM);
    alarm(gOption.duration_);
 
    ThreadPool threadPool(gOption.thread_num_ - 1);
   
    for (int i = 1; i < gOption.thread_num_; ++i) {
        threadPool.appendTask(std::bind(&BenchMark::benchmark, this, i));
    }
    threadPool.run();
    benchmark(0);
    //threadPool.join();
    //sleep(1);
    //统计测试结果

    /*
     *  QPS = req/sec = 请求数/秒
     *  QPS = 总请求数 / ( 进程总数 *   请求时间 )
     *  QPS: 单个进程每秒请求服务器的成功次数
     *
     */
    uint64_t total_request_num = 0;
    uint64_t total_response_num = 0;
    uint64_t total_time = 0;
    for (int i = 0; i < gOption.thread_num_; ++i) {
        total_request_num += testResult_[i].request_num_;
        total_response_num += testResult_[i].response_num_;
        total_time += testResult_[i].use_timer_;
    }

    for(int i = 0;i < gOption.thread_num_;++i)
    {
        std::cout << "this is thread " << i << " :\n";
        std::cout << "\tconnect  time : " << gOption.concurrent_num_ << " use : " << testResult_[i].connect_time_ << " us\n";
        std::cout << "\tuse      time : " << testResult_[i].use_timer_ << " \n";
        std::cout << "\trequest  num  : " << testResult_[i].request_num_ << " \n";
        std::cout << "\tresponse num  : " << testResult_[i].response_num_ << " \n";
    }

    std::cout<<"total result : \n";
    std::cout << "\ttotal request  num  is : " << total_request_num << "\n";
    std::cout << "\ttotal response num  is : " << total_response_num << "\n";
    std::cout << "\ttotal use     time  is : " << total_time << "\n";
    std::cout << "\tQPS                 is : " << (total_response_num*(1000 * 1000) /total_time)*gOption.thread_num_   << "\n";
}